

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O0

DWORD GetLongPathNameW(LPCWSTR lpszShortPath,LPWSTR lpszLongPath,DWORD cchBuffer)

{
  uint uVar1;
  DWORD DVar2;
  size_t sVar3;
  undefined4 local_28;
  DWORD dwPathLen;
  DWORD cchBuffer_local;
  LPWSTR lpszLongPath_local;
  LPCWSTR lpszShortPath_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (lpszShortPath == (LPCWSTR)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    SetLastError(0x57);
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    lpszShortPath_local._4_4_ = 0;
  }
  else {
    DVar2 = GetFileAttributesW(lpszShortPath);
    if (DVar2 == 0xffffffff) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      lpszShortPath_local._4_4_ = 0;
    }
    else {
      sVar3 = PAL_wcslen(lpszShortPath);
      uVar1 = (uint)sVar3;
      local_28 = uVar1 + 1;
      if (lpszLongPath != (LPWSTR)0x0) {
        if (cchBuffer < local_28) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          SetLastError(0x7a);
        }
        else {
          local_28 = uVar1;
          if (lpszShortPath != lpszLongPath) {
            PAL_wcsncpy(lpszLongPath,lpszShortPath,(ulong)cchBuffer);
          }
        }
      }
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      lpszShortPath_local._4_4_ = local_28;
    }
  }
  return lpszShortPath_local._4_4_;
}

Assistant:

DWORD
PALAPI
GetLongPathNameW(
		 IN LPCWSTR lpszShortPath,
         OUT LPWSTR lpszLongPath,
  		 IN DWORD cchBuffer)
{
    DWORD dwPathLen = 0;

    PERF_ENTRY(GetLongPathNameW);
    ENTRY("GetLongPathNameW(lpszShortPath=%p (%S), lpszLongPath=%p (%S), "
          "cchBuffer=%d\n", lpszShortPath, lpszShortPath, lpszLongPath, lpszLongPath, cchBuffer);

    if ( !lpszShortPath )
    {
        ERROR( "lpszShortPath was not a valid pointer.\n" );
        SetLastError( ERROR_INVALID_PARAMETER );
        LOGEXIT("GetLongPathNameW returns DWORD 0\n");
        PERF_EXIT(GetLongPathNameW);
        return 0;
    }
    else if (INVALID_FILE_ATTRIBUTES == GetFileAttributesW( lpszShortPath ))
    {
        // last error has been set by GetFileAttributes
        ERROR( "lpszShortPath does not exist.\n" );
        LOGEXIT("GetLongPathNameW returns DWORD 0\n");
        PERF_EXIT(GetLongPathNameW);
        return 0;
    }

    /* all lengths are # of TCHAR characters */
    /* "required size" includes space for the terminating null character */
    dwPathLen = PAL_wcslen(lpszShortPath)+1;

    /* lpszLongPath == 0 means caller is asking only for size */
    if ( lpszLongPath )
    {
        if ( dwPathLen > cchBuffer )
        {
            ERROR("Buffer is too small, need %d characters\n", dwPathLen);
            SetLastError( ERROR_INSUFFICIENT_BUFFER );
        } else
        {
            if ( lpszShortPath != lpszLongPath )
            {
                // Note: MSDN doesn't specify the behavior of GetLongPathName API
                //       if the buffers are overlap.
                PAL_wcsncpy( lpszLongPath, lpszShortPath, cchBuffer );
            }

            /* actual size not including terminating null is returned */
            dwPathLen--;
        }
    }

    LOGEXIT("GetLongPathNameW returns DWORD %u\n", dwPathLen);
    PERF_EXIT(GetLongPathNameW);
    return dwPathLen;
}